

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::ApprovalTestsCppUTestPlugin::ApprovalTestsCppUTestPlugin
          (ApprovalTestsCppUTestPlugin *this)

{
  undefined8 *in_RDI;
  SimpleString *in_stack_ffffffffffffffb8;
  TestPlugin *in_stack_ffffffffffffffc0;
  
  SimpleString::SimpleString
            ((SimpleString *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  TestPlugin::TestPlugin(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)0x112044);
  *in_RDI = &PTR__ApprovalTestsCppUTestPlugin_001c2370;
  ::std::unique_ptr<ApprovalTests::TestName,std::default_delete<ApprovalTests::TestName>>::
  unique_ptr<std::default_delete<ApprovalTests::TestName>,void>
            ((unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *)
             (in_RDI + 5));
  MemoryLeakWarningPlugin::turnOffNewDeleteOverloads();
  return;
}

Assistant:

ApprovalTestsCppUTestPlugin() : TestPlugin("ApprovalTestsCppUTestPlugin")
        {
            // Turn off CppUTest's leak checks.
            // On some platforms, CppUTest's leak-checking reports leaks
            // in this code, because the way the platform's std::string manages life-times
            // of string storage is not compatible with the requirements of the
            // CppUTest leak-checks.
            MemoryLeakWarningPlugin::turnOffNewDeleteOverloads();
        }